

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImU32 ImHash(void *data,int data_size,ImU32 seed)

{
  byte bVar1;
  uint uVar2;
  byte *pbStack_38;
  uchar c;
  uchar *current;
  uint local_28;
  ImU32 crc;
  ImU32 j;
  ImU32 crc_1;
  ImU32 i;
  ImU32 polynomial;
  ImU32 seed_local;
  int data_size_local;
  void *data_local;
  
  if (ImHash::crc32_lut[1] == 0) {
    for (j = 0; j < 0x100; j = j + 1) {
      crc = j;
      for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
        crc = crc >> 1 ^ -(crc & 1) & 0xedb88320;
      }
      ImHash::crc32_lut[j] = crc;
    }
  }
  uVar2 = seed ^ 0xffffffff;
  pbStack_38 = (byte *)data;
  current._4_4_ = uVar2;
  polynomial = data_size;
  if (data_size < 1) {
    while( true ) {
      bVar1 = *pbStack_38;
      if (bVar1 == 0) break;
      if (((bVar1 == 0x23) && (pbStack_38[1] == 0x23)) && (pbStack_38[2] == 0x23)) {
        current._4_4_ = uVar2;
      }
      pbStack_38 = pbStack_38 + 1;
      current._4_4_ = current._4_4_ >> 8 ^ ImHash::crc32_lut[current._4_4_ & 0xff ^ (uint)bVar1];
    }
  }
  else {
    while (polynomial != 0) {
      bVar1 = *pbStack_38;
      pbStack_38 = pbStack_38 + 1;
      current._4_4_ = current._4_4_ >> 8 ^ ImHash::crc32_lut[current._4_4_ & 0xff ^ (uint)bVar1];
      polynomial = polynomial - 1;
    }
  }
  return current._4_4_ ^ 0xffffffff;
}

Assistant:

ImU32 ImHash(const void* data, int data_size, ImU32 seed)
{
    static ImU32 crc32_lut[256] = { 0 };
    if (!crc32_lut[1])
    {
        const ImU32 polynomial = 0xEDB88320;
        for (ImU32 i = 0; i < 256; i++)
        {
            ImU32 crc = i;
            for (ImU32 j = 0; j < 8; j++)
                crc = (crc >> 1) ^ (ImU32(-int(crc & 1)) & polynomial);
            crc32_lut[i] = crc;
        }
    }

    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* current = (const unsigned char*)data;

    if (data_size > 0)
    {
        // Known size
        while (data_size--)
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *current++];
    }
    else
    {
        // Zero-terminated string
        while (unsigned char c = *current++)
        {
            // We support a syntax of "label###id" where only "###id" is included in the hash, and only "label" gets displayed.
            // Because this syntax is rarely used we are optimizing for the common case.
            // - If we reach ### in the string we discard the hash so far and reset to the seed.
            // - We don't do 'current += 2; continue;' after handling ### to keep the code smaller.
            if (c == '#' && current[0] == '#' && current[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}